

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O0

unique_ptr<wabt::DataScriptModule<(wabt::ScriptModuleType)2>,_std::default_delete<wabt::DataScriptModule<(wabt::ScriptModuleType)2>_>_>
 wabt::MakeUnique<wabt::DataScriptModule<(wabt::ScriptModuleType)2>>(void)

{
  DataScriptModule<(wabt::ScriptModuleType)2> *this;
  __uniq_ptr_data<wabt::DataScriptModule<(wabt::ScriptModuleType)2>,_std::default_delete<wabt::DataScriptModule<(wabt::ScriptModuleType)2>_>,_true,_true>
  in_RDI;
  
  this = (DataScriptModule<(wabt::ScriptModuleType)2> *)operator_new(0x68);
  memset(this,0,0x68);
  DataScriptModule<(wabt::ScriptModuleType)2>::DataScriptModule(this);
  std::
  unique_ptr<wabt::DataScriptModule<(wabt::ScriptModuleType)2>,std::default_delete<wabt::DataScriptModule<(wabt::ScriptModuleType)2>>>
  ::unique_ptr<std::default_delete<wabt::DataScriptModule<(wabt::ScriptModuleType)2>>,void>
            ((unique_ptr<wabt::DataScriptModule<(wabt::ScriptModuleType)2>,std::default_delete<wabt::DataScriptModule<(wabt::ScriptModuleType)2>>>
              *)in_RDI.
                super___uniq_ptr_impl<wabt::DataScriptModule<(wabt::ScriptModuleType)2>,_std::default_delete<wabt::DataScriptModule<(wabt::ScriptModuleType)2>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_wabt::DataScriptModule<(wabt::ScriptModuleType)2>_*,_std::default_delete<wabt::DataScriptModule<(wabt::ScriptModuleType)2>_>_>
                .super__Head_base<0UL,_wabt::DataScriptModule<(wabt::ScriptModuleType)2>_*,_false>.
                _M_head_impl,this);
  return (__uniq_ptr_data<wabt::DataScriptModule<(wabt::ScriptModuleType)2>,_std::default_delete<wabt::DataScriptModule<(wabt::ScriptModuleType)2>_>,_true,_true>
          )(tuple<wabt::DataScriptModule<(wabt::ScriptModuleType)2>_*,_std::default_delete<wabt::DataScriptModule<(wabt::ScriptModuleType)2>_>_>
            )in_RDI.
             super___uniq_ptr_impl<wabt::DataScriptModule<(wabt::ScriptModuleType)2>,_std::default_delete<wabt::DataScriptModule<(wabt::ScriptModuleType)2>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_wabt::DataScriptModule<(wabt::ScriptModuleType)2>_*,_std::default_delete<wabt::DataScriptModule<(wabt::ScriptModuleType)2>_>_>
             .super__Head_base<0UL,_wabt::DataScriptModule<(wabt::ScriptModuleType)2>_*,_false>.
             _M_head_impl;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}